

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

const_reference __thiscall
google::protobuf::RepeatedField<double>::Get(RepeatedField<double> *this,int index)

{
  int iVar1;
  double *pdVar2;
  Nonnull<const_char_*> pcVar3;
  long v1;
  
  v1 = (long)index;
  if (index < 0) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>(v1,0,"index >= 0");
  }
  else {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    iVar1 = internal::SooRep::size
                      (&this->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    if (index < iVar1) {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (v1,(long)iVar1,"index < size()");
    }
    if (pcVar3 == (Nonnull<const_char_*>)0x0) {
      pdVar2 = elements(this,(undefined1  [16])
                             ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
      return pdVar2 + v1;
    }
  }
  else {
    Get();
  }
  Get();
}

Assistant:

inline const Element& RepeatedField<Element>::Get(int index) const
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  if constexpr (internal::GetBoundsCheckMode() ==
                internal::BoundsCheckMode::kAbort) {
    internal::RuntimeAssertInBounds(index, size());
  } else {
    ABSL_DCHECK_GE(index, 0);
    ABSL_DCHECK_LT(index, size());
  }
  return elements(is_soo())[index];
}